

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign
          (CImg<unsigned_int> *this,uint *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint *puVar1;
  uint uVar2;
  CImg<unsigned_int> *pCVar3;
  uint *__dest;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = size_z * size_c * size_y * size_x;
  if (values == (uint *)0x0 || uVar2 == 0) {
    pCVar3 = assign(this);
    return pCVar3;
  }
  uVar4 = this->_height * this->_width * this->_depth * this->_spectrum;
  puVar1 = this->_data;
  if ((puVar1 == values) && (uVar2 == uVar4)) {
    pCVar3 = assign(this,size_x,size_y,size_z,size_c);
    return pCVar3;
  }
  uVar5 = (ulong)uVar2;
  if ((this->_is_shared == false) && ((puVar1 <= values + uVar5 && (values < puVar1 + uVar4)))) {
    __dest = (uint *)operator_new__(uVar5 * 4);
    memcpy(__dest,values,uVar5 * 4);
    if (puVar1 != (uint *)0x0) {
      operator_delete__(puVar1);
    }
    this->_data = __dest;
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
  }
  else {
    assign(this,size_x,size_y,size_z,size_c);
    if (this->_is_shared == true) {
      memmove(this->_data,values,uVar5 << 2);
    }
    else {
      memcpy(this->_data,values,uVar5 << 2);
    }
  }
  return this;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned int siz = size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      const unsigned int curr_siz = size();
      if (values==_data && siz==curr_siz) return assign(size_x,size_y,size_z,size_c);
      if (_is_shared || values+siz<_data || values>=_data+size()) {
        assign(size_x,size_y,size_z,size_c);
        if (_is_shared) std::memmove(_data,values,siz*sizeof(T));
        else std::memcpy(_data,values,siz*sizeof(T));
      } else {
        T *new_data = 0;
        try { new_data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "assign() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(size_x*size_y*size_z*size_c*sizeof(T)),size_x,size_y,size_z,size_c);
        }
        std::memcpy(new_data,values,siz*sizeof(T));
        delete[] _data; _data = new_data; _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      }
      return *this;
    }